

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32FloatWaveGenerator.cpp
# Opt level: O0

float __thiscall
MT32Emu::LA32FloatWaveGenerator::getPCMSample(LA32FloatWaveGenerator *this,uint position)

{
  short sVar1;
  float local_34;
  float sampleValue;
  Bit16s pcmSample;
  uint position_local;
  LA32FloatWaveGenerator *this_local;
  
  sampleValue = (float)position;
  if (this->pcmWaveLength <= position) {
    if ((this->pcmWaveLooped & 1U) == 0) {
      return 0.0;
    }
    sampleValue = (float)(position % this->pcmWaveLength);
  }
  sVar1 = this->pcmWaveAddress[(uint)sampleValue];
  local_34 = EXP2F(((float)((int)sVar1 & 0x7fff) - 32787.0) / 2048.0);
  if (((int)sVar1 & 0x8000U) != 0) {
    local_34 = -local_34;
  }
  return local_34;
}

Assistant:

float LA32FloatWaveGenerator::getPCMSample(unsigned int position) {
	if (position >= pcmWaveLength) {
		if (!pcmWaveLooped) {
			return 0;
		}
		position = position % pcmWaveLength;
	}
	Bit16s pcmSample = pcmWaveAddress[position];
	float sampleValue = EXP2F(((pcmSample & 32767) - 32787.0f) / 2048.0f);
	return ((pcmSample & 32768) == 0) ? sampleValue : -sampleValue;
}